

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzbstrmatrix.cpp
# Opt level: O3

TPZStructMatrix * __thiscall
TPZBandStructMatrix<std::complex<double>,_TPZStructMatrixOR<std::complex<double>_>_>::Clone
          (TPZBandStructMatrix<std::complex<double>,_TPZStructMatrixOR<std::complex<double>_>_>
           *this)

{
  long lVar1;
  TPZStructMatrix *this_00;
  
  this_00 = (TPZStructMatrix *)operator_new(0xb8);
  lVar1 = *(long *)(*(long *)&(this->super_TPZStructMatrixT<std::complex<double>_>).
                              super_TPZStructMatrix + -0x60);
  *(undefined8 *)&this_00->field_0xa8 = 0x19afe18;
  *(undefined8 *)this_00 = 0x19afee0;
  *(undefined4 *)(this_00 + 1) =
       *(undefined4 *)
        ((long)&(this->super_TPZStructMatrixT<std::complex<double>_>).super_TPZStructMatrix.fMesh +
        lVar1);
  this_00[1].field_0x4 =
       *(undefined1 *)
        ((long)&(this->super_TPZStructMatrixT<std::complex<double>_>).super_TPZStructMatrix.fMesh +
        lVar1 + 4);
  TPZStructMatrix::TPZStructMatrix
            (this_00,&PTR_construction_vtable_104__019af738,(TPZStructMatrix *)this);
  *(undefined8 *)&this_00->field_0xa8 = 0x19af6b8;
  *(undefined8 *)this_00 = 0x19af4f8;
  *(undefined8 *)&this_00->field_0xa0 = 0x19af5b8;
  return this_00;
}

Assistant:

TPZStructMatrix * TPZBandStructMatrix<TVar,TPar>::Clone(){
    return new TPZBandStructMatrix(*this);
}